

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_spi_transfernb(char *tbuf,char *rbuf,uint32_t len)

{
  uint32_t *paddr_00;
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t *paddr_01;
  uint local_38;
  uint local_34;
  uint32_t RXCnt;
  uint32_t TXCnt;
  uint32_t *fifo;
  uint32_t *paddr;
  uint32_t len_local;
  char *rbuf_local;
  char *tbuf_local;
  
  paddr_00 = bcm2835_spi0;
  paddr_01 = bcm2835_spi0 + 1;
  local_34 = 0;
  local_38 = 0;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr_00,0x80,0x80);
  while (local_34 < len || local_38 < len) {
    for (; uVar3 = bcm2835_peri_read(paddr_00), (uVar3 & 0x40000) != 0 && local_34 < len;
        local_34 = local_34 + 1) {
      bVar1 = bcm2835_correct_order(tbuf[local_34]);
      bcm2835_peri_write_nb(paddr_01,(uint)bVar1);
    }
    for (; uVar3 = bcm2835_peri_read(paddr_00), (uVar3 & 0x20000) != 0 && local_38 < len;
        local_38 = local_38 + 1) {
      uVar3 = bcm2835_peri_read_nb(paddr_01);
      uVar2 = bcm2835_correct_order((uint8_t)uVar3);
      rbuf[local_38] = uVar2;
    }
  }
  do {
    uVar3 = bcm2835_peri_read_nb(paddr_00);
  } while ((uVar3 & 0x10000) == 0);
  bcm2835_peri_set_bits(paddr_00,0,0x80);
  return;
}

Assistant:

void bcm2835_spi_transfernb(char* tbuf, char* rbuf, uint32_t len)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t TXCnt=0;
    uint32_t RXCnt=0;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral? 
    */

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    /* Use the FIFO's to reduce the interbyte times */
    while((TXCnt < len)||(RXCnt < len))
    {
        /* TX fifo not full, so add some more bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))&&(TXCnt < len ))
        {
	    bcm2835_peri_write_nb(fifo, bcm2835_correct_order(tbuf[TXCnt]));
	    TXCnt++;
        }
        /* Rx fifo not empty, so get the next received bytes */
        while(((bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD))&&( RXCnt < len ))
        {
	    rbuf[RXCnt] = bcm2835_correct_order(bcm2835_peri_read_nb(fifo));
	    RXCnt++;
        }
    }
    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
}